

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::api::anon_unknown_1::createMultipleSharedResourcesTest<vkt::api::(anonymous_namespace)::Device>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,undefined8 context,
          Parameters *param_4)

{
  RefBase<vk::VkDevice_s_*> local_2a8;
  string local_288;
  RefBase<vk::VkDevice_s_*> local_268;
  RefBase<vk::VkDevice_s_*> local_248;
  undefined8 local_230;
  RefBase<vk::VkDevice_s_*> local_228;
  Environment env;
  Resources res;
  
  local_230 = context;
  Environment::Environment(&env,(Context *)this,4);
  Device::Resources::Resources(&res,&env,(Parameters *)&local_230);
  Device::create((Move<vk::VkDevice_s_*> *)&local_2a8,&env,&res,param_4);
  local_288.field_2._M_allocated_capacity = (size_type)local_2a8.m_data.deleter.m_allocator;
  local_288._M_dataplus._M_p = (pointer)local_2a8.m_data.object;
  local_288._M_string_length = (size_type)local_2a8.m_data.deleter.m_destroyDevice;
  local_2a8.m_data.object = (VkDevice_s *)0x0;
  local_2a8.m_data.deleter.m_destroyDevice = (DestroyDeviceFunc)0x0;
  local_2a8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::VkDevice_s_*>::~RefBase(&local_2a8);
  Device::create((Move<vk::VkDevice_s_*> *)&local_268,&env,&res,param_4);
  local_2a8.m_data.deleter.m_allocator = local_268.m_data.deleter.m_allocator;
  local_2a8.m_data.object = local_268.m_data.object;
  local_2a8.m_data.deleter.m_destroyDevice = local_268.m_data.deleter.m_destroyDevice;
  local_268.m_data.object = (VkDevice_s *)0x0;
  local_268.m_data.deleter.m_destroyDevice = (DestroyDeviceFunc)0x0;
  local_268.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::VkDevice_s_*>::~RefBase(&local_268);
  Device::create((Move<vk::VkDevice_s_*> *)&local_248,&env,&res,param_4);
  local_268.m_data.deleter.m_allocator = local_248.m_data.deleter.m_allocator;
  local_268.m_data.object = local_248.m_data.object;
  local_268.m_data.deleter.m_destroyDevice = local_248.m_data.deleter.m_destroyDevice;
  local_248.m_data.object = (VkDevice_s *)0x0;
  local_248.m_data.deleter.m_destroyDevice = (DestroyDeviceFunc)0x0;
  local_248.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::VkDevice_s_*>::~RefBase(&local_248);
  Device::create((Move<vk::VkDevice_s_*> *)&local_228,&env,&res,param_4);
  local_248.m_data.deleter.m_allocator = local_228.m_data.deleter.m_allocator;
  local_248.m_data.object = local_228.m_data.object;
  local_248.m_data.deleter.m_destroyDevice = local_228.m_data.deleter.m_destroyDevice;
  local_228.m_data.object = (VkDevice_s *)0x0;
  local_228.m_data.deleter.m_destroyDevice = (DestroyDeviceFunc)0x0;
  local_228.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::VkDevice_s_*>::~RefBase(&local_228);
  ::vk::refdetails::RefBase<vk::VkDevice_s_*>::~RefBase(&local_248);
  ::vk::refdetails::RefBase<vk::VkDevice_s_*>::~RefBase(&local_268);
  ::vk::refdetails::RefBase<vk::VkDevice_s_*>::~RefBase(&local_2a8);
  ::vk::refdetails::RefBase<vk::VkDevice_s_*>::~RefBase((RefBase<vk::VkDevice_s_*> *)&local_288);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_288,"Ok",(allocator<char> *)&local_2a8);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_288);
  std::__cxx11::string::~string((string *)&local_288);
  Device::Resources::~Resources(&res);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMultipleSharedResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 4u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}